

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O3

t_pvalue __thiscall xemmai::t_directory::f_read(t_directory *this,t_os *a_library)

{
  t_type *a_type;
  size_type sVar1;
  ulong uVar2;
  uint uVar3;
  path *ppVar4;
  undefined8 uVar5;
  long lVar6;
  t_queue<128UL> *ptVar7;
  t_os *in_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar8;
  allocator<wchar_t> *in_R8;
  undefined1 *this_00;
  undefined1 auVar9 [16];
  t_pvalue tVar10;
  basic_string_view<char,_std::char_traits<char>_> __str;
  t_object *local_a0;
  path local_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_70;
  undefined1 local_50 [16];
  
  lVar6 = *(long *)a_library;
  auVar9 = __tls_get_addr(&PTR_0011ed00);
  aVar8.v_integer = auVar9._8_8_;
  if (lVar6 != *auVar9._0_8_) {
    xemmai::f_throw(10,L"not owned.");
  }
  if ((a_library->v_type_path).v_p == (t_type_of<xemmai::t_object> *)0x0) {
    ptVar7 = (t_queue<128UL> *)0x0;
    goto LAB_0010e6d5;
  }
  this_00 = &a_library->field_0x8;
  ppVar4 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                             ((directory_iterator *)this_00);
  uVar5 = std::filesystem::status(ppVar4);
  a_type = (in_RDX->v_type_directory_entry).v_p;
  ppVar4 = (path *)std::filesystem::__cxx11::directory_iterator::operator*
                             ((directory_iterator *)this_00);
  sVar1 = (ppVar4->_M_pathname)._M_string_length;
  if (sVar1 == 0) {
LAB_0010e62d:
    std::filesystem::__cxx11::path::path(&local_98);
  }
  else {
    uVar2 = *(ulong *)&ppVar4->_M_cmpts;
    uVar3 = (uint)uVar2;
    if ((uVar2 & 3) == 0) {
      if ((ppVar4->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/') {
        if ((uVar2 & 3) == 0) {
          lVar6 = std::filesystem::__cxx11::path::_List::end();
          if ((*(ulong *)&ppVar4->_M_cmpts & 3) == 0) {
            ppVar4 = (path *)(lVar6 + -0x30);
          }
          uVar3 = (uint)*(undefined8 *)&ppVar4->_M_cmpts;
        }
        if ((~uVar3 & 3) == 0) goto LAB_0010e5e5;
      }
      goto LAB_0010e62d;
    }
    if ((uVar3 & 3) != 3) goto LAB_0010e62d;
LAB_0010e5e5:
    std::filesystem::__cxx11::path::path(&local_98,ppVar4);
  }
  __str._M_str = local_50;
  __str._M_len = (size_t)local_98._M_pathname._M_dataplus._M_p;
  std::filesystem::__cxx11::path::
  _S_str_convert<wchar_t,std::char_traits<wchar_t>,std::allocator<wchar_t>>
            (&local_70,(path *)local_98._M_pathname._M_string_length,__str,in_R8);
  local_a0 = (t_object *)
             xemmai::t_string::f_instantiate(local_70._M_dataplus._M_p,local_70._M_string_length);
  t_enum_of<std::filesystem::file_type,_xemmai::t_os>::f_transfer
            ((t_enum_of<std::filesystem::file_type,_xemmai::t_os> *)local_50,in_RDX,(file_type)uVar5
            );
  t_enum_of<std::filesystem::perms,_xemmai::t_os>::f_transfer
            ((t_enum_of<std::filesystem::perms,_xemmai::t_os> *)&stack0xffffffffffffffc0,in_RDX,
             (perms)((ulong)uVar5 >> 0x20));
  ptVar7 = (t_queue<128UL> *)
           f_new_value<xemmai::t_object*,xemmai::t_value<xemmai::t_pointer>,xemmai::t_value<xemmai::t_pointer>>
                     (a_type,&local_a0,(t_value<xemmai::t_pointer> *)local_50,
                      (t_value<xemmai::t_pointer> *)&stack0xffffffffffffffc0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity * 4 + 4);
  }
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)this_00);
  aVar8 = extraout_RDX;
LAB_0010e6d5:
  (this->super_t_owned).v_owner = ptVar7;
  tVar10.field_0.v_integer = aVar8.v_integer;
  tVar10.super_t_pointer.v_p = (t_object *)this;
  return tVar10;
}

Assistant:

t_pvalue t_directory::f_read(t_os* a_library)
{
	f_owned_or_throw();
	if (v_i == decltype(v_i){}) return nullptr;
	auto status = v_i->status();
	auto p = f_new_value(a_library->v_type_directory_entry, t_string::f_instantiate(v_i->path().filename().wstring()), a_library->f_as(status.type()), a_library->f_as(status.permissions()));
	++v_i;
	return p;
}